

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_client_start(Curl_easy *data)

{
  undefined1 *puVar1;
  curl_trc_feat *pcVar2;
  CURLcode CVar3;
  Curl_creader *pCVar4;
  
  if (((data->req).field_0xd1 & 0x80) != 0) {
    pCVar4 = (data->req).reader_stack;
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)) &&
        (0 < Curl_trc_feat_read.log_level)))) {
      Curl_trc_read(data,"client start, rewind readers");
    }
    for (; pCVar4 != (Curl_creader *)0x0; pCVar4 = pCVar4->next) {
      CVar3 = (*pCVar4->crt->rewind)(data,pCVar4);
      if (CVar3 != CURLE_OK) {
        Curl_failf(data,"rewind of client reader \'%s\' failed: %d",pCVar4->crt->name,(ulong)CVar3);
        return CVar3;
      }
    }
    puVar1 = &(data->req).field_0xd1;
    *puVar1 = *puVar1 & 0x7f;
    pCVar4 = (data->req).reader_stack;
    while (pCVar4 != (Curl_creader *)0x0) {
      (data->req).reader_stack = pCVar4->next;
      (*pCVar4->crt->do_close)(data,pCVar4);
      (*Curl_cfree)(pCVar4);
      pCVar4 = (data->req).reader_stack;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_client_start(struct Curl_easy *data)
{
  if(data->req.rewind_read) {
    struct Curl_creader *r = data->req.reader_stack;
    CURLcode result = CURLE_OK;

    CURL_TRC_READ(data, "client start, rewind readers");
    while(r) {
      result = r->crt->rewind(data, r);
      if(result) {
        failf(data, "rewind of client reader '%s' failed: %d",
              r->crt->name, result);
        return result;
      }
      r = r->next;
    }
    data->req.rewind_read = FALSE;
    cl_reset_reader(data);
  }
  return CURLE_OK;
}